

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

void copy_slot(lua_State *L,TValue *f,int idx)

{
  TValue TVar1;
  TValue *pTVar2;
  GCobj *v;
  GCobj *o;
  
  if (idx == -0x2711) {
    o = (GCobj *)(L->base[-2].u64 & 0x7fffffffffff);
    if ((o->gch).gct != '\b') {
      lj_err_msg(L,LJ_ERR_NOENV);
    }
    (o->gch).env.gcptr64 = f->u64 & 0x7fffffffffff;
    if (8 < ((int)(f->field_4).it >> 0xf) + 0xdU) {
      return;
    }
    v = (GCobj *)((ulong)f->field_4 & 0x7fffffffffff);
    if (((v->gch).marked & 3) == 0) {
      return;
    }
  }
  else {
    if (idx == -0x2712) {
      (L->env).gcptr64 = f->u64 & 0x7fffffffffff;
      return;
    }
    pTVar2 = index2adr(L,idx);
    TVar1 = (TValue)*(TValue *)&f->field_4;
    *pTVar2 = TVar1;
    if (-0x2713 < idx) {
      return;
    }
    if (8 < ((int)TVar1.field_4.it >> 0xf) + 0xdU) {
      return;
    }
    v = (GCobj *)(TVar1.u64 & 0x7fffffffffff);
    if (((v->gch).marked & 3) == 0) {
      return;
    }
    o = (GCobj *)(L->base[-2].u64 & 0x7fffffffffff);
  }
  if (((o->gch).marked & 4) == 0) {
    return;
  }
  lj_gc_barrierf((global_State *)(L->glref).ptr64,o,v);
  return;
}

Assistant:

static void copy_slot(lua_State *L, TValue *f, int idx)
{
  if (idx == LUA_GLOBALSINDEX) {
    lj_checkapi(tvistab(f), "stack slot %d is not a table", idx);
    /* NOBARRIER: A thread (i.e. L) is never black. */
    setgcref(L->env, obj2gco(tabV(f)));
  } else if (idx == LUA_ENVIRONINDEX) {
    GCfunc *fn = curr_func(L);
    if (fn->c.gct != ~LJ_TFUNC)
      lj_err_msg(L, LJ_ERR_NOENV);
    lj_checkapi(tvistab(f), "stack slot %d is not a table", idx);
    setgcref(fn->c.env, obj2gco(tabV(f)));
    lj_gc_barrier(L, fn, f);
  } else {
    TValue *o = index2adr_check(L, idx);
    copyTV(L, o, f);
    if (idx < LUA_GLOBALSINDEX)  /* Need a barrier for upvalues. */
      lj_gc_barrier(L, curr_func(L), f);
  }
}